

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeFilterOne2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  uint Entry;
  uint Entry_00;
  uint uVar3;
  uint uVar4;
  Vec_Bit_t *p_00;
  Vec_Bit_t *vMarked_00;
  bool bVar5;
  int Rank;
  int Box;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vMarked;
  Vec_Bit_t *vIsLeaf;
  Vec_Int_t *vTree_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  vMarked_00 = Vec_BitStart(iVar1);
  Rank = 0;
  for (Box = 0; iVar1 = Vec_IntSize(vTree), Box + 1 < iVar1; Box = Box + 2) {
    iVar1 = Vec_IntEntry(vTree,Box);
    Vec_IntEntry(vTree,Box + 1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  for (Box = 0; iVar1 = Vec_IntSize(vTree), Box + 1 < iVar1; Box = Box + 2) {
    iVar1 = Vec_IntEntry(vTree,Box);
    Vec_IntEntry(vTree,Box + 1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Vec_BitWriteEntry(p_00,iVar1,0);
  }
  Box = 0;
  while( true ) {
    bVar5 = false;
    if (Box < p->nObjs) {
      _k = Gia_ManObj(p,Box);
      bVar5 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_k);
    if ((iVar1 != 0) && (iVar1 = Vec_BitEntry(p_00,Box), iVar1 != 0)) {
      Acec_TreeMarkTFI_rec(p,Box,vMarked_00);
    }
    Box = Box + 1;
  }
  Box = 0;
  do {
    iVar1 = Vec_IntSize(vTree);
    if (iVar1 <= Box + 1) {
      Vec_IntShrink(vTree,Rank);
      Vec_BitFree(p_00);
      Vec_BitFree(vMarked_00);
      return;
    }
    Entry = Vec_IntEntry(vTree,Box);
    Entry_00 = Vec_IntEntry(vTree,Box + 1);
    iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 3);
    iVar1 = Vec_BitEntry(vMarked_00,iVar1);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 4);
      iVar1 = Vec_BitEntry(vMarked_00,iVar1);
      if (iVar1 != 0) goto LAB_00837c6d;
      iVar1 = Rank + 1;
      Vec_IntWriteEntry(vTree,Rank,Entry);
      Rank = Rank + 2;
      Vec_IntWriteEntry(vTree,iVar1,Entry_00);
    }
    else {
LAB_00837c6d:
      uVar3 = Vec_IntEntry(vAdds,Entry * 6 + 3);
      uVar4 = Vec_IntEntry(vAdds,Entry * 6 + 4);
      printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)Entry,(ulong)uVar3,(ulong)uVar4,
             (ulong)Entry_00);
    }
    Box = Box + 2;
  } while( true );
}

Assistant:

void Acec_TreeFilterOne2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark leaves
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+3), 0 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4), 0 );
    }
    // mark TFI of leaves
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_BitEntry(vIsLeaf, i) )
            Acec_TreeMarkTFI_rec( p, i, vMarked );
    // additional one
//if ( 10942 < Gia_ManObjNum(p) )
//    Acec_TreeMarkTFI_rec( p, 10942, vMarked );
    // remove those that overlap with the marked TFI
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vMarked );
}